

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void slang::uintToStrImpl<unsigned_long>
               (SmallVectorBase<char> *buffer,char *format,unsigned_long value)

{
  size_type sVar1;
  int iVar2;
  ValueInitTag local_29;
  
  iVar2 = snprintf((char *)0x0,0,format,value);
  sVar1 = buffer->len;
  SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
            (buffer,(long)iVar2 + sVar1 + 1,&local_29);
  snprintf(buffer->data_ + sVar1,(long)iVar2 + 1,format,value);
  buffer->len = buffer->len - 1;
  return;
}

Assistant:

void uintToStrImpl(SmallVectorBase<char>& buffer, const char* format, T value) {
    size_t sz = (size_t)snprintf(nullptr, 0, format, value);
    size_t offset = buffer.size();
    buffer.resize(buffer.size() + sz + 1);

    snprintf(&buffer[offset], sz + 1, format, value);
    buffer.pop_back();
}